

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  byte bVar1;
  GCtab *t;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  TValue *pTVar5;
  long lVar6;
  GCobj *o;
  long *plVar7;
  uint uVar8;
  
  pTVar5 = L->base;
  if ((L->top <= pTVar5) || ((pTVar5->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar8 = (pTVar5->u32).lo;
  plVar7 = (long *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  plVar7[2] = (long)L;
  lVar6 = (ulong)*(ushort *)((ulong)uVar8 + 6) * 0x10;
  if (((*(uint *)(*plVar7 + lVar6) & 0xf0000000) != 0x20000000) ||
     (*(int *)(*plVar7 + lVar6 + 4) != 8)) goto LAB_0014e74e;
  uVar4 = *(long *)((ulong)uVar8 + 8) - plVar7[0x17];
  if (uVar4 < 0x1000) {
    iVar2 = (int)uVar4;
    uVar8 = (iVar2 - 8U) / 0x8c;
    uVar8 = uVar8 * 0x20 + ((uVar8 * -0x8c + iVar2) - 8 >> 2);
    if ((uVar8 >> 5) * 0xc + uVar8 * 4 + 8 != iVar2) goto LAB_0014e697;
  }
  else {
LAB_0014e697:
    uVar8 = 0xffffffff;
  }
  if ((uVar8 < *(uint *)(plVar7 + 0x19)) && (*(short *)(plVar7[0x18] + (ulong)uVar8 * 2) != 0)) {
    t = (GCtab *)plVar7[5];
    if (uVar8 < t->asize) {
      pTVar5 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)uVar8 * 8);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,uVar8);
    }
    if (fn == (GCfunc *)0x0) {
      (pTVar5->field_2).it = 0xffffffff;
      *(undefined2 *)(plVar7[0x18] + (ulong)uVar8 * 2) = 0;
      uVar3 = *(uint *)((long)plVar7 + 0xcc);
      if (uVar8 < *(uint *)((long)plVar7 + 0xcc)) {
        uVar3 = uVar8;
      }
      *(uint *)((long)plVar7 + 0xcc) = uVar3;
    }
    else {
      (pTVar5->u32).lo = (uint32_t)fn;
      (pTVar5->field_2).it = 0xfffffff7;
      bVar1 = t->marked;
      uVar3 = (uint)CONCAT71((int7)((ulong)pTVar5 >> 8),bVar1);
      if ((bVar1 & 4) != 0) {
        uVar4 = (ulong)(L->glref).ptr32;
        t->marked = bVar1 & 0xfb;
        uVar3 = *(uint *)(uVar4 + 0x3c);
        (t->gclist).gcptr32 = uVar3;
        *(int *)(uVar4 + 0x3c) = (int)t;
      }
    }
    return uVar3;
  }
LAB_0014e74e:
  lj_err_caller(L,LJ_ERR_FFI_BADCBACK);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}